

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O0

CURLcode Curl_altsvc_parse(Curl_easy *data,altsvcinfo *asi,char *value,alpnid srcalpnid,
                          char *srchost,unsigned_short srcport)

{
  char cVar1;
  bool bVar2;
  undefined8 __nptr;
  char *pcVar3;
  CURLcode CVar4;
  int iVar5;
  alpnid dstalpnid_00;
  char *pcVar6;
  size_t sVar7;
  altsvc *p_00;
  time_t tVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  ulong local_f0;
  unsigned_long port;
  char *hostp;
  _Bool valid;
  char *pcStack_d8;
  _Bool persist;
  time_t maxage;
  char *pcStack_c8;
  _Bool quoted;
  char *end_ptr;
  unsigned_long num;
  char option [32];
  char *value_ptr;
  size_t dstlen;
  char *dsthost;
  long lStack_70;
  alpnid dstalpnid;
  size_t entries;
  CURLcode result;
  unsigned_short dstport;
  altsvc *as;
  char alpnbuf [10];
  char *p;
  unsigned_short srcport_local;
  char *srchost_local;
  alpnid srcalpnid_local;
  char *value_local;
  altsvcinfo *asi_local;
  Curl_easy *data_local;
  
  alpnbuf._2_8_ = value;
  memset((void *)((long)&as + 6),0,10);
  CVar4 = getalnum((char **)(alpnbuf + 2),(char *)((long)&as + 6),10);
  lStack_70 = 0;
  if (CVar4 == CURLE_OK) {
    iVar5 = curl_strequal((char *)((long)&as + 6),"clear");
    entries._6_2_ = srcport;
    if (iVar5 == 0) {
      do {
        if (*(char *)alpnbuf._2_8_ != '=') {
          return CURLE_OK;
        }
        dstalpnid_00 = alpn2alpnid((char *)((long)&as + 6));
        if (*(char *)(alpnbuf._2_8_ + 1) != '\"') {
          return CURLE_OK;
        }
        dstlen = (long)"n,a=%s,\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29;
        bVar11 = false;
        pcStack_d8 = (char *)0x15180;
        hostp._7_1_ = false;
        bVar2 = true;
        pcVar6 = (char *)(alpnbuf._2_8_ + 2);
        if (*pcVar6 == ':') {
          alpnbuf._2_8_ = pcVar6;
          value_ptr = (char *)strlen(srchost);
          pcVar6 = srchost;
        }
        else {
          pcVar3 = pcVar6;
          if (*pcVar6 == '[') {
            alpnbuf._2_8_ = alpnbuf._2_8_ + 3;
            sVar7 = strspn((char *)alpnbuf._2_8_,"0123456789abcdefABCDEF:.");
            if (*(char *)(alpnbuf._2_8_ + sVar7) != ']') {
              return CURLE_OK;
            }
            value_ptr = (char *)(sVar7 + 2);
            alpnbuf._2_8_ = alpnbuf._2_8_ + sVar7 + 1;
          }
          else {
            while( true ) {
              alpnbuf._2_8_ = pcVar3;
              bVar10 = false;
              if ((((*(char *)alpnbuf._2_8_ != '\0') &&
                   ((*(char *)alpnbuf._2_8_ < '0' || (bVar10 = true, '9' < *(char *)alpnbuf._2_8_)))
                   ) && ((*(char *)alpnbuf._2_8_ < 'a' ||
                         (bVar10 = true, 'z' < *(char *)alpnbuf._2_8_)))) &&
                 (((*(char *)alpnbuf._2_8_ < 'A' || (bVar10 = true, 'Z' < *(char *)alpnbuf._2_8_))
                  && (bVar10 = true, *(char *)alpnbuf._2_8_ != '.')))) {
                bVar10 = *(char *)alpnbuf._2_8_ == '-';
              }
              if (!bVar10) break;
              pcVar3 = (char *)(alpnbuf._2_8_ + 1);
            }
            value_ptr = (char *)(alpnbuf._2_8_ - (long)pcVar6);
          }
          if ((value_ptr == (char *)0x0) || ((char *)0x1ff < value_ptr)) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Excessive alt-svc hostname, ignoring.");
            }
            bVar2 = false;
            pcVar6 = (char *)dstlen;
          }
        }
        dstlen = (size_t)pcVar6;
        if (*(char *)alpnbuf._2_8_ == ':') {
          local_f0 = 0;
          alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
          pcVar6 = (char *)alpnbuf._2_8_;
          if (('/' < *(char *)alpnbuf._2_8_) && (*(char *)alpnbuf._2_8_ < ':')) {
            local_f0 = strtoul((char *)alpnbuf._2_8_,&stack0xffffffffffffff38,10);
            pcVar6 = pcStack_c8;
          }
          pcStack_c8 = pcVar6;
          if ((((local_f0 == 0) || (0xffff < local_f0)) || (pcStack_c8 == (char *)alpnbuf._2_8_)) ||
             (*pcStack_c8 != '\"')) {
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              Curl_infof(data,"Unknown alt-svc port number, ignoring.");
            }
            bVar2 = false;
          }
          else {
            entries._6_2_ = curlx_ultous(local_f0);
            alpnbuf._2_8_ = pcStack_c8;
          }
        }
        cVar1 = *(char *)alpnbuf._2_8_;
        alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
        if (cVar1 != '\"') {
          return CURLE_OK;
        }
        while( true ) {
          while( true ) {
            bVar10 = true;
            if (*(char *)alpnbuf._2_8_ != ' ') {
              bVar10 = *(char *)alpnbuf._2_8_ == '\t';
            }
            if (!bVar10) break;
            alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
          }
          if (((*(char *)alpnbuf._2_8_ != ';') ||
              (alpnbuf._2_8_ = alpnbuf._2_8_ + 1, *(char *)alpnbuf._2_8_ == '\0')) ||
             ((*(char *)alpnbuf._2_8_ == '\n' || (*(char *)alpnbuf._2_8_ == '\r')))) break;
          CVar4 = getalnum((char **)(alpnbuf + 2),(char *)&num,0x20);
          if (CVar4 != CURLE_OK) {
            num._0_1_ = 0;
          }
          while( true ) {
            bVar10 = false;
            if ((*(char *)alpnbuf._2_8_ != '\0') && (bVar10 = true, *(char *)alpnbuf._2_8_ != ' '))
            {
              bVar10 = *(char *)alpnbuf._2_8_ == '\t';
            }
            if (!bVar10) break;
            alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
          }
          if (*(char *)alpnbuf._2_8_ != '=') {
            return CURLE_OK;
          }
          do {
            lVar9 = alpnbuf._2_8_;
            alpnbuf._2_8_ = lVar9 + 1;
            bVar10 = false;
            if ((*(char *)alpnbuf._2_8_ != '\0') && (bVar10 = true, *(char *)alpnbuf._2_8_ != ' '))
            {
              bVar10 = *(char *)alpnbuf._2_8_ == '\t';
            }
          } while (bVar10);
          if (*(char *)alpnbuf._2_8_ == '\0') {
            return CURLE_OK;
          }
          if (*(char *)alpnbuf._2_8_ == '\"') {
            alpnbuf._2_8_ = lVar9 + 2;
            bVar11 = true;
          }
          __nptr = alpnbuf._2_8_;
          if (bVar11) {
            while( true ) {
              bVar10 = false;
              if (*(char *)alpnbuf._2_8_ != '\0') {
                bVar10 = *(char *)alpnbuf._2_8_ != '\"';
              }
              if (!bVar10) break;
              alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
            }
            cVar1 = *(char *)alpnbuf._2_8_;
            alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
            if (cVar1 == '\0') {
              return CURLE_OK;
            }
          }
          else {
            while( true ) {
              bVar10 = false;
              if ((((*(char *)alpnbuf._2_8_ != '\0') &&
                   (bVar10 = false, *(char *)alpnbuf._2_8_ != ' ')) &&
                  (bVar10 = false, *(char *)alpnbuf._2_8_ != '\t')) &&
                 (bVar10 = false, *(char *)alpnbuf._2_8_ != ';')) {
                bVar10 = *(char *)alpnbuf._2_8_ != ',';
              }
              if (!bVar10) break;
              alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
            }
          }
          end_ptr = (char *)strtoul((char *)__nptr,&stack0xffffffffffffff38,10);
          if ((pcStack_c8 != (char *)__nptr) && (end_ptr != (char *)0xffffffffffffffff)) {
            iVar5 = curl_strequal("ma",(char *)&num);
            if (iVar5 == 0) {
              iVar5 = curl_strequal("persist",(char *)&num);
              if ((iVar5 != 0) && (end_ptr == (char *)0x1)) {
                hostp._7_1_ = true;
              }
            }
            else {
              pcStack_d8 = end_ptr;
            }
          }
        }
        if ((dstalpnid_00 != ALPN_none) && (bVar2)) {
          lVar9 = lStack_70 + 1;
          if (lStack_70 == 0) {
            altsvc_flush(asi,srcalpnid,srchost,srcport);
          }
          p_00 = altsvc_createid(srchost,(char *)dstlen,(size_t)value_ptr,srcalpnid,dstalpnid_00,
                                 (uint)srcport,(uint)entries._6_2_);
          lStack_70 = lVar9;
          if (p_00 != (altsvc *)0x0) {
            tVar8 = time((time_t *)0x0);
            p_00->expires = (time_t)(pcStack_d8 + tVar8);
            p_00->persist = hostp._7_1_;
            Curl_llist_append(&asi->list,p_00,&p_00->node);
            if (((data != (Curl_easy *)0x0) &&
                ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
               (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) {
              pcVar6 = Curl_alpnid2str(dstalpnid_00);
              Curl_infof(data,"Added alt-svc: %s:%d over %s",dstlen,(ulong)entries._6_2_,pcVar6);
            }
          }
        }
        if (*(char *)alpnbuf._2_8_ == ',') {
          alpnbuf._2_8_ = alpnbuf._2_8_ + 1;
          CVar4 = getalnum((char **)(alpnbuf + 2),(char *)((long)&as + 6),10);
          if (CVar4 != CURLE_OK) {
            return CURLE_OK;
          }
        }
        bVar11 = false;
        if (((*(char *)alpnbuf._2_8_ != '\0') && (bVar11 = false, *(char *)alpnbuf._2_8_ != ';')) &&
           (bVar11 = false, *(char *)alpnbuf._2_8_ != '\n')) {
          bVar11 = *(char *)alpnbuf._2_8_ != '\r';
        }
      } while (bVar11);
    }
    else {
      altsvc_flush(asi,srcalpnid,srchost,srcport);
    }
  }
  else if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) {
    Curl_infof(data,"Excessive alt-svc header, ignoring.");
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_altsvc_parse(struct Curl_easy *data,
                           struct altsvcinfo *asi, const char *value,
                           enum alpnid srcalpnid, const char *srchost,
                           unsigned short srcport)
{
  const char *p = value;
  char alpnbuf[MAX_ALTSVC_ALPNLEN] = "";
  struct altsvc *as;
  unsigned short dstport = srcport; /* the same by default */
  CURLcode result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
  size_t entries = 0;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif
  if(result) {
    infof(data, "Excessive alt-svc header, ignoring.");
    return CURLE_OK;
  }

  DEBUGASSERT(asi);

  /* "clear" is a magic keyword */
  if(strcasecompare(alpnbuf, "clear")) {
    /* Flush cached alternatives for this source origin */
    altsvc_flush(asi, srcalpnid, srchost, srcport);
    return CURLE_OK;
  }

  do {
    if(*p == '=') {
      /* [protocol]="[host][:port]" */
      enum alpnid dstalpnid = alpn2alpnid(alpnbuf); /* the same by default */
      p++;
      if(*p == '\"') {
        const char *dsthost = "";
        size_t dstlen = 0; /* destination hostname length */
        const char *value_ptr;
        char option[32];
        unsigned long num;
        char *end_ptr;
        bool quoted = FALSE;
        time_t maxage = 24 * 3600; /* default is 24 hours */
        bool persist = FALSE;
        bool valid = TRUE;
        p++;
        if(*p != ':') {
          /* hostname starts here */
          const char *hostp = p;
          if(*p == '[') {
            /* pass all valid IPv6 letters - does not handle zone id */
            dstlen = strspn(++p, "0123456789abcdefABCDEF:.");
            if(p[dstlen] != ']')
              /* invalid host syntax, bail out */
              break;
            /* we store the IPv6 numerical address *with* brackets */
            dstlen += 2;
            p = &p[dstlen-1];
          }
          else {
            while(*p && (ISALNUM(*p) || (*p == '.') || (*p == '-')))
              p++;
            dstlen = p - hostp;
          }
          if(!dstlen || (dstlen >= MAX_ALTSVC_HOSTLEN)) {
            infof(data, "Excessive alt-svc hostname, ignoring.");
            valid = FALSE;
          }
          else {
            dsthost = hostp;
          }
        }
        else {
          /* no destination name, use source host */
          dsthost = srchost;
          dstlen = strlen(srchost);
        }
        if(*p == ':') {
          unsigned long port = 0;
          p++;
          if(ISDIGIT(*p))
            /* a port number */
            port = strtoul(p, &end_ptr, 10);
          else
            end_ptr = (char *)p; /* not left uninitialized */
          if(!port || port > USHRT_MAX || end_ptr == p || *end_ptr != '\"') {
            infof(data, "Unknown alt-svc port number, ignoring.");
            valid = FALSE;
          }
          else {
            dstport = curlx_ultous(port);
            p = end_ptr;
          }
        }
        if(*p++ != '\"')
          break;
        /* Handle the optional 'ma' and 'persist' flags. Unknown flags
           are skipped. */
        for(;;) {
          while(ISBLANK(*p))
            p++;
          if(*p != ';')
            break;
          p++; /* pass the semicolon */
          if(!*p || ISNEWLINE(*p))
            break;
          result = getalnum(&p, option, sizeof(option));
          if(result) {
            /* skip option if name is too long */
            option[0] = '\0';
          }
          while(*p && ISBLANK(*p))
            p++;
          if(*p != '=')
            return CURLE_OK;
          p++;
          while(*p && ISBLANK(*p))
            p++;
          if(!*p)
            return CURLE_OK;
          if(*p == '\"') {
            /* quoted value */
            p++;
            quoted = TRUE;
          }
          value_ptr = p;
          if(quoted) {
            while(*p && *p != '\"')
              p++;
            if(!*p++)
              return CURLE_OK;
          }
          else {
            while(*p && !ISBLANK(*p) && *p!= ';' && *p != ',')
              p++;
          }
          num = strtoul(value_ptr, &end_ptr, 10);
          if((end_ptr != value_ptr) && (num < ULONG_MAX)) {
            if(strcasecompare("ma", option))
              maxage = (time_t)num;
            else if(strcasecompare("persist", option) && (num == 1))
              persist = TRUE;
          }
        }
        if(dstalpnid && valid) {
          if(!entries++)
            /* Flush cached alternatives for this source origin, if any - when
               this is the first entry of the line. */
            altsvc_flush(asi, srcalpnid, srchost, srcport);

          as = altsvc_createid(srchost, dsthost, dstlen,
                               srcalpnid, dstalpnid,
                               srcport, dstport);
          if(as) {
            /* The expires time also needs to take the Age: value (if any) into
               account. [See RFC 7838 section 3.1] */
            as->expires = maxage + time(NULL);
            as->persist = persist;
            Curl_llist_append(&asi->list, as, &as->node);
            infof(data, "Added alt-svc: %s:%d over %s", dsthost, dstport,
                  Curl_alpnid2str(dstalpnid));
          }
        }
      }
      else
        break;
      /* after the double quote there can be a comma if there is another
         string or a semicolon if no more */
      if(*p == ',') {
        /* comma means another alternative is presented */
        p++;
        result = getalnum(&p, alpnbuf, sizeof(alpnbuf));
        if(result)
          break;
      }
    }
    else
      break;
  } while(*p && (*p != ';') && (*p != '\n') && (*p != '\r'));

  return CURLE_OK;
}